

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rust_field_type.cc
# Opt level: O2

RustFieldType google::protobuf::compiler::rust::GetRustFieldType(Type type)

{
  LogMessage *this;
  Type type_local;
  LogMessage local_18 [16];
  
  if (type - TYPE_DOUBLE < 0x12) {
    return *(RustFieldType *)(&DAT_004103b0 + (ulong)(type - TYPE_DOUBLE) * 4);
  }
  type_local = type;
  absl::lts_20240722::log_internal::LogMessage::LogMessage
            (local_18,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/compiler/rust/rust_field_type.cc"
             ,0x30);
  this = absl::lts_20240722::log_internal::LogMessage::operator<<
                   (local_18,(char (*) [21])"Unknown field type: ");
  absl::lts_20240722::log_internal::LogMessage::
  operator<<<google::protobuf::internal::FieldDescriptorLite::Type,_0>(this,&type_local);
  absl::lts_20240722::log_internal::LogMessage::~LogMessage(local_18);
  protobuf::internal::Unreachable
            ("/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/compiler/rust/rust_field_type.cc"
             ,0x31);
}

Assistant:

RustFieldType GetRustFieldType(FieldDescriptor::Type type) {
  switch (type) {
    case FieldDescriptor::TYPE_BOOL:
      return RustFieldType::BOOL;
    case FieldDescriptor::TYPE_INT32:
    case FieldDescriptor::TYPE_SINT32:
    case FieldDescriptor::TYPE_SFIXED32:
      return RustFieldType::INT32;
    case FieldDescriptor::TYPE_INT64:
    case FieldDescriptor::TYPE_SINT64:
    case FieldDescriptor::TYPE_SFIXED64:
      return RustFieldType::INT64;
    case FieldDescriptor::TYPE_FIXED32:
    case FieldDescriptor::TYPE_UINT32:
      return RustFieldType::UINT32;
    case FieldDescriptor::TYPE_FIXED64:
    case FieldDescriptor::TYPE_UINT64:
      return RustFieldType::UINT64;
    case FieldDescriptor::TYPE_FLOAT:
      return RustFieldType::FLOAT;
    case FieldDescriptor::TYPE_DOUBLE:
      return RustFieldType::DOUBLE;
    case FieldDescriptor::TYPE_BYTES:
      return RustFieldType::BYTES;
    case FieldDescriptor::TYPE_STRING:
      return RustFieldType::STRING;
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_GROUP:
      return RustFieldType::MESSAGE;
    case FieldDescriptor::TYPE_ENUM:
      return RustFieldType::ENUM;
  }
  ABSL_LOG(ERROR) << "Unknown field type: " << type;
  internal::Unreachable();
}